

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullseq.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  undefined4 local_74;
  char *pcStack_70;
  int option_index;
  char *aStrRegex;
  char *end;
  long value;
  int length;
  int convert;
  int just_count;
  int count;
  int exclude;
  int names_from_stdin;
  int max;
  int min;
  FILE *names_fp;
  char *names;
  char *in;
  char **ppcStack_18;
  int c;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  names = (char *)0x0;
  names_fp = (FILE *)0x0;
  _max = (FILE *)0x0;
  names_from_stdin = -1;
  exclude = -1;
  count = 0;
  just_count = 0;
  convert = 0;
  length = 0;
  value._4_4_ = 0;
  value._0_4_ = 0x32;
  pcStack_70 = (char *)0x0;
  verbose_flag = 0;
  progname = *argv;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  if (argc < 4) {
    show_usage(1);
  }
  do {
    local_74 = 0;
    in._4_4_ = getopt_long((int)argv_local,ppcStack_18,"Vvh?cetq:i:g:Nn:m:a:l:",main::long_options,
                           &local_74);
    if (in._4_4_ == -1) {
      if (verbose_flag != 0) {
        fprintf(_stderr,"verbose flag is set\n");
        fprintf(_stderr,"Input is %s\n",names);
        if (value._4_4_ != 0) {
          fprintf(_stderr,"Input will be converted between FASTQ and FASTA\n");
        }
        if (count == 0) {
          if (names_fp != (FILE *)0x0) {
            if (just_count == 0) {
              fprintf(_stderr,"Names in %s will be included\n",names_fp);
            }
            else {
              fprintf(_stderr,"Names in %s will be excluded\n",names_fp);
            }
          }
        }
        else if (just_count == 0) {
          fprintf(_stderr,"Names in STDIN will be included\n");
        }
        else {
          fprintf(_stderr,"Names in STDIN will be excluded\n");
        }
        if (pcStack_70 != (char *)0x0) {
          if (just_count == 0) {
            fprintf(_stderr,"Only sequences matching %s will be output\n",pcStack_70);
          }
          else {
            fprintf(_stderr,"Only sequences not matching %s will be output\n",pcStack_70);
          }
        }
        if (0 < exclude) {
          fprintf(_stderr,"Only sequences less than %i will be output\n",(ulong)(uint)exclude);
        }
        if (0 < names_from_stdin) {
          fprintf(_stderr,"Only sequences greater than %i will be output\n",
                  (ulong)(uint)names_from_stdin);
        }
        if (0 < (int)(uint)value) {
          fprintf(_stderr,"Output will be %i columns long\n",(ulong)(uint)value);
        }
        if (0 < length) {
          fprintf(_stderr,"Output will be counted only\n");
        }
      }
      if (names == (char *)0x0) {
        fprintf(_stderr,"Error: Input file is required.\n");
        argv_local._4_4_ = 1;
      }
      else if ((names_fp == (FILE *)0x0) || (iVar1 = strcmp(names,(char *)names_fp), iVar1 != 0)) {
        if ((names_fp == (FILE *)0x0) || (count == 0)) {
          if ((pcStack_70 == (char *)0x0) || ((names_fp == (FILE *)0x0 && (count == 0)))) {
            if ((names_from_stdin < 1) || ((exclude < 1 || (names_from_stdin < exclude)))) {
              if ((names_fp == (FILE *)0x0) && (count == 0)) {
                if (pcStack_70 == (char *)0x0) {
                  convert = pull_by_size(names,names_from_stdin,exclude,(uint)value,value._4_4_,
                                         length);
                }
                else {
                  convert = pull_by_re(names,pcStack_70,names_from_stdin,exclude,(uint)value,
                                       just_count,value._4_4_,length);
                }
              }
              else {
                if (names_fp == (FILE *)0x0) {
                  _max = _stdin;
                }
                else {
                  _max = fopen((char *)names_fp,"r");
                  if (_max == (FILE *)0x0) {
                    fprintf(_stderr,"%s - failed to open names file %s\n",progname,names_fp);
                    exit(1);
                  }
                }
                convert = pull_by_name(names,(FILE *)_max,names_from_stdin,exclude,(uint)value,
                                       just_count,value._4_4_,length);
              }
              free(names);
              if (names_fp != (FILE *)0x0) {
                free(names_fp);
              }
              if (_max != (FILE *)0x0) {
                fclose(_max);
              }
              if (pcStack_70 != (char *)0x0) {
                free(pcStack_70);
              }
              if (verbose_flag != 0) {
                fprintf(_stderr,"Pulled %i entries\n",(ulong)(uint)convert);
              }
              fclose(_stderr);
              fclose(_stdout);
              fclose(_stdin);
              argv_local._4_4_ = 0;
            }
            else {
              fprintf(_stderr,"Error: Max is less than or equal to min.\n");
              argv_local._4_4_ = 1;
            }
          }
          else {
            fprintf(_stderr,
                    "Error: You can\'t use a names file or names from STDIN and a regex match.\n");
            argv_local._4_4_ = 1;
          }
        }
        else {
          fprintf(_stderr,"Error: Cannot use names from STDIN *and* names from a file.\n");
          argv_local._4_4_ = 1;
        }
      }
      else {
        fprintf(_stderr,"Error: Input file is same as names file.\n");
        argv_local._4_4_ = 1;
      }
      return argv_local._4_4_;
    }
    switch(in._4_4_) {
    case 0x3f:
      break;
    default:
      abort();
    case 0x4e:
      count = 1;
      break;
    case 0x56:
      printf("Version is %s\n","1.0.2");
      break;
    case 0x61:
      end = (char *)strtol(_optarg,&aStrRegex,0);
      if ((*aStrRegex != '\0') || (piVar3 = __errno_location(), *piVar3 != 0)) {
        fprintf(_stderr,"Maximum value (-a) argument \'%s\' is not an integer\n",_optarg);
        return 1;
      }
      exclude = atoi(_optarg);
      break;
    case 99:
      value._4_4_ = 1;
      QUALITY_SCORE = 0x3d;
      break;
    case 0x65:
      just_count = 1;
      break;
    case 0x67:
      sVar2 = strlen(_optarg);
      pcStack_70 = (char *)malloc(sVar2 + 1);
      strcpy(pcStack_70,_optarg);
      break;
    case 0x68:
      show_usage(1);
      break;
    case 0x69:
      sVar2 = strlen(_optarg);
      names = (char *)malloc(sVar2 + 1);
      strcpy(names,_optarg);
      break;
    case 0x6c:
      end = (char *)strtol(_optarg,&aStrRegex,0);
      if ((*aStrRegex != '\0') || (piVar3 = __errno_location(), *piVar3 != 0)) {
        fprintf(_stderr,"Sequence length value (-l) argument \'%s\' is not an integer\n",_optarg);
        return 1;
      }
      value._0_4_ = atoi(_optarg);
      break;
    case 0x6d:
      end = (char *)strtol(_optarg,&aStrRegex,0);
      if ((*aStrRegex != '\0') || (piVar3 = __errno_location(), *piVar3 != 0)) {
        fprintf(_stderr,"Maximum value (-m) argument \'%s\' is not an integer\n",_optarg);
        return 1;
      }
      names_from_stdin = atoi(_optarg);
      break;
    case 0x6e:
      sVar2 = strlen(_optarg);
      names_fp = (FILE *)malloc(sVar2 + 1);
      strcpy((char *)names_fp,_optarg);
      break;
    case 0x71:
      end = (char *)strtol(_optarg,&aStrRegex,0);
      if ((*aStrRegex != '\0') || (piVar3 = __errno_location(), *piVar3 != 0)) {
        fprintf(_stderr,
                "Quality ASCII value (-q) is invalid - must be an ASCII code (e.g. 73, which is \'I\')\n"
               );
        return 1;
      }
      QUALITY_SCORE = atoi(_optarg);
      break;
    case 0x74:
      length = 1;
      break;
    case 0x76:
      verbose_flag = 1;
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
	int c;
	char *in = NULL,*names = NULL;
	FILE *names_fp = NULL;
	int min = -1, max = -1;
	int names_from_stdin = 0;
	int exclude = 0;
	int count = 0;
	int just_count = 0; /* flag for just counting the output */
	int convert = 0;
	int length = 50;
	long value;
	char *end;
	char *aStrRegex = NULL;

	extern char *optarg; /* external from getopt */

	verbose_flag = 0; /* assume not verbose */

	progname = argv[0];
	if (argc < 4) { /* progname + at least 3 other args */
		show_usage(EXIT_FAILURE);
	}

	while(1) {
		static struct option long_options[] =
		{
			{"verbose",     no_argument,       0, 'v'},
			{"convert",     no_argument,       0, 'c'},
			{"exclude",     no_argument,       0, 'e'},
			{"count",       no_argument,       0, 't'},
			{"version",     no_argument,       0, 'V'},
			{"help",        no_argument,       0, 'h'},
			{"input",       required_argument, 0, 'i'},
			{"regex",       required_argument, 0, 'g'},
			{"names",       required_argument, 0, 'n'},
			{"names_stdin", no_argument,       0, 'N'},
			{"min",         required_argument, 0, 'm'},
			{"max",         required_argument, 0, 'a'},
			{"length",      required_argument, 0, 'l'},
			{"quality",     required_argument, 0, 'q'},
			{0, 0, 0, 0}
		};

		/* getopt_long stores the option index here. */
		int option_index = 0;

		c = getopt_long (argc, argv, "Vvh?cetq:i:g:Nn:m:a:l:", long_options, &option_index);

		/* Detect the end of the options. */
		if (c == -1)
			break;

		switch (c) {
			case 'v':
				verbose_flag = 1;
				break;

			case 'i':
				in = (char*) malloc(strlen(optarg)+1);
				strcpy(in,optarg);
				break;

			case 'g':
				aStrRegex = (char*) malloc(strlen(optarg)+1);
				strcpy(aStrRegex, optarg);
				break;

			case 'n':
				names = (char*) malloc(strlen(optarg)+1);
				strcpy(names, optarg);
				break;

			case 'N':
				names_from_stdin = 1;
				break;

			case 'm':
				value = strtol(optarg, &end, 0);
				if (*end == '\0' && errno == 0) {
					min = atoi(optarg);
				} else {
					fprintf(stderr, "Maximum value (-m) argument '%s' is not an integer\n", optarg);
					return EXIT_FAILURE;
				}
				break;

			case 'a':
				value = strtol(optarg, &end, 0);
				if (*end == '\0' && errno == 0) {
					max = atoi(optarg);
				} else {
					fprintf(stderr, "Maximum value (-a) argument '%s' is not an integer\n", optarg);
					return EXIT_FAILURE;
				}
				break;

			case 'c':
				convert = 1;
				QUALITY_SCORE = 61;
				break;

			case 't':
				just_count = 1;
				break;

			case 'q':
				value = strtol(optarg, &end, 0);
				if (*end == 0 && errno == 0) {
					QUALITY_SCORE = atoi(optarg);
				} else {
					fprintf(stderr, "Quality ASCII value (-q) is invalid - must be an ASCII code (e.g. 73, which is 'I')\n");
					return EXIT_FAILURE;
				}
				break;

			case 'e':
				exclude = 1;
				break;

			case 'l':
				value = strtol(optarg, &end,0);
				if (*end == '\0' && errno == 0) {
					length = atoi(optarg);
				} else {
					fprintf(stderr, "Sequence length value (-l) argument '%s' is not an integer\n", optarg);
					return EXIT_FAILURE;
				}
				break;

			case 'V':
				/* version */
				printf("Version is %s\n", PULLSEQ_VERSION);
				break;

			case 'h':
				show_usage(EXIT_FAILURE);
				break;

			case '?':
				/* getopt_long already printed an error message. */
				break;

			default:
				abort ();
		}
	}

	/* Instead of reporting '--verbose'
	   and '--brief' as they are encountered,
	   we report the final status resulting from them. */
	if (verbose_flag) {
		fprintf(stderr, "verbose flag is set\n");
		fprintf(stderr,"Input is %s\n", in);
		if (convert)
			fprintf(stderr,"Input will be converted between FASTQ and FASTA\n");
		if (names_from_stdin) {
			if (exclude)
				fprintf(stderr,"Names in STDIN will be excluded\n");
			else
				fprintf(stderr,"Names in STDIN will be included\n");

		} else if (names != NULL) {
			if (exclude) {
				fprintf(stderr,"Names in %s will be excluded\n", names);
            }
			else {
				fprintf(stderr,"Names in %s will be included\n", names);
            }
		}
		if (aStrRegex)
			if (exclude) {
				fprintf(stderr,"Only sequences not matching %s will be output\n", aStrRegex);
            }
			else {
				fprintf(stderr,"Only sequences matching %s will be output\n", aStrRegex);
            }
		if (max > 0)
			fprintf(stderr,"Only sequences less than %i will be output\n", max);
		if (min > 0)
			fprintf(stderr,"Only sequences greater than %i will be output\n", min);
		if (length > 0)
			fprintf(stderr,"Output will be %i columns long\n", length);
		if (just_count > 0)
			fprintf(stderr,"Output will be counted only\n");
	}

	/* check validity of given argument set */
	if (!in) {
		fprintf (stderr, "Error: Input file is required.\n");
		return EXIT_FAILURE;
	}

	if (names) {
		if (!strcmp(in, names)) {
			fprintf (stderr, "Error: Input file is same as names file.\n");
			return EXIT_FAILURE;
		}
	}

	if (names && names_from_stdin) {
		fprintf (stderr, "Error: Cannot use names from STDIN *and* names from a file.\n");
		return EXIT_FAILURE;
	}

	if (aStrRegex) {
		if (names || names_from_stdin) {
			fprintf (stderr, "Error: You can't use a names file or names from STDIN and a regex match.\n");
			return EXIT_FAILURE;
		}
	}

	if (min > 0 && max > 0) {
		if (max <= min) {
			fprintf (stderr, "Error: Max is less than or equal to min.\n");
			return EXIT_FAILURE;
		}
	}

	if (names || names_from_stdin) {
		if (names) {
			names_fp = fopen(names,"r");
			if (!names_fp) {
				fprintf(stderr,"%s - failed to open names file %s\n",progname, names);
				exit(EXIT_FAILURE);
			}
		} else {
			names_fp = stdin;
		}
		count = pull_by_name(in, names_fp, min, max, length, exclude, convert, just_count);
	} else if (aStrRegex) {
		count = pull_by_re(in, aStrRegex, min, max, length, exclude, convert, just_count);
	} else {
		count = pull_by_size(in, min, max, length, convert, just_count);
	}

	/* free up memory */
	free(in);

	if (names)
		free(names);

	if (names_fp)
		fclose(names_fp);

	if (aStrRegex)
		free(aStrRegex);

	if (verbose_flag)
		fprintf(stderr,"Pulled %i entries\n",count);

	/* close streams */
	fclose(stderr);
	fclose(stdout);
	fclose(stdin);
	return EXIT_SUCCESS;
}